

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::UnknownField::InternalSerializeLengthDelimitedNoTag
          (UnknownField *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  uint size;
  uint extraout_EAX;
  uint8_t *puVar2;
  EpsCopyOutputStream *extraout_RDX;
  byte *unaff_RBX;
  char *data;
  ulong uVar3;
  uint uVar4;
  char local_20 [16];
  
  if (this->type_ == 3) {
    data = (((this->data_).string_value)->_M_dataplus)._M_p;
    uVar1 = ((this->data_).string_value)->_M_string_length;
    size = (uint)uVar1;
    if (size < 0x80) {
      uVar3 = uVar1 & 0xffffffff;
    }
    else {
      uVar3 = uVar1 & 0xffffffff;
      do {
        uVar4 = (uint)uVar3;
        *target = (byte)uVar3 | 0x80;
        uVar3 = uVar3 >> 7;
        target = target + 1;
      } while (0x3fff < uVar4);
    }
    *target = (byte)uVar3;
    unaff_RBX = target + 1;
    if ((long)(int)size <= (long)stream->end_ - (long)unaff_RBX) {
      memcpy(unaff_RBX,data,uVar1 & 0xffffffff);
      return unaff_RBX + (int)size;
    }
  }
  else {
    data = local_20;
    InternalSerializeLengthDelimitedNoTag();
    stream = extraout_RDX;
    size = extraout_EAX;
  }
  puVar2 = io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,unaff_RBX);
  return puVar2;
}

Assistant:

uint8_t* UnknownField::InternalSerializeLengthDelimitedNoTag(
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  ABSL_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const absl::string_view data = *data_.string_value;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = stream->WriteRaw(data.data(), data.size(), target);
  return target;
}